

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qscopedpointer.h
# Opt level: O3

void __thiscall
QEventDispatcherGlib::unregisterSocketNotifier(QEventDispatcherGlib *this,QSocketNotifier *notifier)

{
  long lVar1;
  long lVar2;
  void *pvVar3;
  long i;
  
  lVar1 = *(long *)(this + 8);
  lVar2 = *(long *)(lVar1 + 0xa8);
  if (*(long *)(lVar2 + 0x70) != 0) {
    i = 0;
    do {
      pvVar3 = *(void **)(*(long *)(lVar2 + 0x68) + i * 8);
      if (*(QSocketNotifier **)((long)pvVar3 + 8) == notifier) {
        g_source_remove_poll(lVar2,pvVar3);
        QList<GPollFDWithQSocketNotifier_*>::removeAt
                  ((QList<GPollFDWithQSocketNotifier_*> *)(*(long *)(lVar1 + 0xa8) + 0x60),i);
        operator_delete(pvVar3,0x10);
        lVar2 = *(long *)(*(long *)(lVar1 + 0xa8) + 0x78);
        if (lVar2 < i) {
          return;
        }
        *(long *)(*(long *)(lVar1 + 0xa8) + 0x78) = lVar2 + -1;
        return;
      }
      i = i + 1;
    } while (*(long *)(lVar2 + 0x70) != i);
  }
  return;
}

Assistant:

T *get() const noexcept
    {
        return d;
    }